

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapequad.cpp
# Opt level: O1

void pzshape::TPZShapeQuad::ShapeInternal
               (int side,TPZVec<double> *x,int order,TPZFMatrix<double> *phi,
               TPZFMatrix<double> *dphi)

{
  if (side - 9U < 0xfffffffb) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/pzshapequad.cpp"
               ,0x173);
  }
  if (side - 4U < 4) {
    TPZShapeLinear::ShapeInternal(x,order,phi,dphi);
    return;
  }
  if (side == 8) {
    ShapeInternal(x,order,phi,dphi);
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Wrong side parameter",0x14);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/pzshapequad.cpp"
             ,0x187);
}

Assistant:

void TPZShapeQuad::ShapeInternal(int side, TPZVec<REAL> &x, int order,
                                     TPZFMatrix<REAL> &phi, TPZFMatrix<REAL> &dphi) {
        if (side < 4 || side > 8) {
            DebugStop();
        }
        
        switch (side) {

            case 4:
            case 5:
            case 6:
            case 7:
            {
                pzshape::TPZShapeLinear::ShapeInternal(x, order, phi, dphi);
            }
                break;
            case 8:
            {
                ShapeInternal(x, order, phi, dphi);
            }
                break;
            default:
            LOGPZ_ERROR(logger,"Wrong side parameter")
                DebugStop();
                break;
        }
      
        
      
    }